

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_variance_sse2.c
# Opt level: O2

uint64_t aom_mse_wxh_16bit_highbd_sse2
                   (uint16_t *dst,int dstride,uint16_t *src,int sstride,int w,int h)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined1 auVar5 [14];
  undefined1 auVar6 [14];
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined1 auVar9 [12];
  undefined1 auVar10 [12];
  ulong uVar11;
  long lVar12;
  bool bVar13;
  long lVar14;
  long lVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  short sVar20;
  ushort uVar21;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  
  if (w == 8) {
    uVar11 = 0;
    if (0 < h) {
      uVar11 = (ulong)(uint)h;
    }
    lVar14 = 0;
    lVar15 = 0;
    while (bVar13 = uVar11 != 0, uVar11 = uVar11 - 1, bVar13) {
      sVar20 = src[3] - dst[3];
      auVar10._2_2_ = src[4] - dst[4];
      auVar10._0_2_ = sVar20;
      auVar10._4_8_ = 0;
      auVar6._12_2_ = sVar20;
      auVar6._0_12_ = auVar10 << 0x30;
      auVar8._6_8_ = 0;
      auVar8._0_6_ = (uint6)(CONCAT44(auVar6._10_4_,CONCAT22(src[2] - dst[2],sVar20)) >> 0x10);
      auVar17._6_8_ = SUB148(auVar8 << 0x40,6);
      auVar17._4_2_ = src[1] - dst[1];
      auVar17._2_2_ = 0;
      auVar17._0_2_ = *src - *dst;
      auVar17._14_2_ = 0;
      auVar19._2_2_ = 0;
      auVar19._0_2_ = src[4] - dst[4];
      auVar19._4_2_ = src[5] - dst[5];
      auVar19._6_2_ = 0;
      auVar19._8_2_ = src[6] - dst[6];
      auVar19._10_2_ = 0;
      auVar19._12_2_ = src[7] - dst[7];
      auVar19._14_2_ = 0;
      auVar17 = pmaddwd(auVar17,auVar17);
      auVar19 = pmaddwd(auVar19,auVar19);
      lVar14 = lVar14 + (ulong)auVar17._8_4_ +
               (auVar19._0_8_ & 0xffffffff) + (auVar17._0_8_ & 0xffffffff) + (ulong)auVar19._8_4_;
      lVar15 = lVar15 + (ulong)auVar17._12_4_ + (ulong)auVar19._4_4_ + (ulong)auVar17._4_4_ +
               (ulong)auVar19._12_4_;
      src = src + sstride;
      dst = dst + dstride;
    }
  }
  else {
    if (w != 4) {
      return 0xffffffffffffffff;
    }
    lVar14 = 0;
    lVar15 = 0;
    for (lVar12 = 0; lVar12 < h; lVar12 = lVar12 + 2) {
      uVar1 = *(undefined8 *)(dst + dstride);
      uVar2 = *(undefined8 *)dst;
      uVar3 = *(undefined8 *)(src + sstride);
      uVar4 = *(undefined8 *)src;
      sVar20 = (short)((ulong)uVar4 >> 0x30) - (short)((ulong)uVar2 >> 0x30);
      uVar21 = (short)uVar3 - (short)uVar1;
      auVar9._2_2_ = uVar21;
      auVar9._0_2_ = sVar20;
      auVar9._4_8_ = 0;
      auVar5._12_2_ = sVar20;
      auVar5._0_12_ = auVar9 << 0x30;
      auVar7._6_8_ = 0;
      auVar7._0_6_ = (uint6)(CONCAT44(auVar5._10_4_,
                                      CONCAT22((short)((ulong)uVar4 >> 0x20) -
                                               (short)((ulong)uVar2 >> 0x20),sVar20)) >> 0x10);
      auVar16._6_8_ = SUB148(auVar7 << 0x40,6);
      auVar16._4_2_ = (short)((ulong)uVar4 >> 0x10) - (short)((ulong)uVar2 >> 0x10);
      auVar16._2_2_ = 0;
      auVar16._0_2_ = (short)uVar4 - (short)uVar2;
      auVar16._14_2_ = 0;
      auVar18._2_2_ = 0;
      auVar18._0_2_ = uVar21;
      auVar18._4_2_ = (short)((ulong)uVar3 >> 0x10) - (short)((ulong)uVar1 >> 0x10);
      auVar18._6_2_ = 0;
      auVar18._8_2_ = (short)((ulong)uVar3 >> 0x20) - (short)((ulong)uVar1 >> 0x20);
      auVar18._10_2_ = 0;
      auVar18._12_2_ = (short)((ulong)uVar3 >> 0x30) - (short)((ulong)uVar1 >> 0x30);
      auVar18._14_2_ = 0;
      auVar17 = pmaddwd(auVar16,auVar16);
      auVar19 = pmaddwd(auVar18,auVar18);
      lVar14 = lVar14 + (ulong)auVar17._8_4_ +
               (auVar19._0_8_ & 0xffffffff) + (auVar17._0_8_ & 0xffffffff) + (ulong)auVar19._8_4_;
      lVar15 = lVar15 + (ulong)auVar17._12_4_ + (ulong)auVar19._4_4_ + (ulong)auVar17._4_4_ +
               (ulong)auVar19._12_4_;
      src = src + (long)sstride * 2;
      dst = dst + (long)dstride * 2;
    }
  }
  return lVar15 + lVar14;
}

Assistant:

uint64_t aom_mse_wxh_16bit_highbd_sse2(uint16_t *dst, int dstride,
                                       uint16_t *src, int sstride, int w,
                                       int h) {
  assert((w == 8 || w == 4) && (h == 8 || h == 4) &&
         "w=8/4 and h=8/4 must satisfy");
  switch (w) {
    case 4: return mse_4xh_16bit_highbd_sse2(dst, dstride, src, sstride, h);
    case 8: return mse_8xh_16bit_highbd_sse2(dst, dstride, src, sstride, h);
    default: assert(0 && "unsupported width"); return -1;
  }
}